

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::addAssign
          (TIntermediate *this,TOperator op,TIntermTyped *left,TIntermTyped *right,TSourceLoc *loc)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TIntermTyped *pTVar4;
  undefined4 extraout_var_05;
  TIntermBinary *node;
  TIntermediate *this_00;
  
  while( true ) {
    iVar3 = (*(((TIntermSymbol *)left)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0x1e])(left);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var,iVar3));
    if (iVar3 == 0x10) {
      return (TIntermTyped *)0x0;
    }
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    if (iVar3 == 0x10) {
      return (TIntermTyped *)0x0;
    }
    if (((op & ~EOpSequence) != EOpAddAssign) ||
       (iVar3 = (*(((TIntermSymbol *)left)->super_TIntermTyped).type._vptr_TType[7])
                          (&(((TIntermSymbol *)left)->super_TIntermTyped).type), iVar3 != 0x12)) {
      iVar3 = (*(((TIntermSymbol *)left)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x1e])(left);
      pTVar4 = addConversion(this,op,(TType *)CONCAT44(extraout_var_04,iVar3),right);
      if (pTVar4 != (TIntermTyped *)0x0) {
        iVar3 = (*(((TIntermSymbol *)left)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                  [0x1e])(left);
        this_00 = this;
        pTVar4 = addUniShapeConversion(this,op,(TType *)CONCAT44(extraout_var_05,iVar3),pTVar4);
        node = addBinaryNode(this_00,op,left,pTVar4,loc);
        bVar2 = promote(this,&node->super_TIntermOperator);
        if (bVar2) {
          (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x34])(node);
          return (TIntermTyped *)node;
        }
      }
      return (TIntermTyped *)0x0;
    }
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xc0))
                      ((long *)CONCAT44(extraout_var_01,iVar3));
    if (cVar1 == '\0') {
      return (TIntermTyped *)0x0;
    }
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x138))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    if (cVar1 == '\0') break;
    right = addBinaryMath(this,(op != EOpAddAssign) + EOpAdd,left,right,loc);
    if (right == (TIntermTyped *)0x0) {
      return (TIntermTyped *)0x0;
    }
    iVar3 = (*(((TIntermSymbol *)left)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc]
            )(left);
    left = &addSymbol(this,(TIntermSymbol *)CONCAT44(extraout_var_03,iVar3))->super_TIntermTyped;
    op = EOpAssign;
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* TIntermediate::addAssign(TOperator op, TIntermTyped* left, TIntermTyped* right,
    const TSourceLoc& loc)
{
    // No block assignment
    if (left->getType().getBasicType() == EbtBlock || right->getType().getBasicType() == EbtBlock)
        return nullptr;

    // Convert "reference += int" to "reference = reference + int". We need this because the
    // "reference + int" calculation involves a cast back to the original type, which makes it
    // not an lvalue.
    if ((op == EOpAddAssign || op == EOpSubAssign) && left->isReference()) {
        if (!(right->getType().isScalar() && right->getType().isIntegerDomain()))
            return nullptr;

        TIntermTyped* node = addBinaryMath(op == EOpAddAssign ? EOpAdd : EOpSub, left, right, loc);
        if (!node)
            return nullptr;

        TIntermSymbol* symbol = left->getAsSymbolNode();
        left = addSymbol(*symbol);

        node = addAssign(EOpAssign, left, node, loc);
        return node;
    }

    //
    // Like adding binary math, except the conversion can only go
    // from right to left.
    //

    // convert base types, nullptr return means not possible
    right = addConversion(op, left->getType(), right);
    if (right == nullptr)
        return nullptr;

    // convert shape
    right = addUniShapeConversion(op, left->getType(), right);

    // build the node
    TIntermBinary* node = addBinaryNode(op, left, right, loc);

    if (! promote(node))
        return nullptr;

    node->updatePrecision();

    return node;
}